

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbbackingstore.cpp
# Opt level: O3

void __thiscall QFbBackingStore::resize(QFbBackingStore *this,QSize *size,QRegion *staticContents)

{
  Format FVar1;
  undefined8 uVar2;
  long *plVar3;
  long in_FS_OFFSET;
  QImage local_50 [16];
  undefined8 local_40;
  code *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QImage::size();
  if (((size->wd).m_i != (int)uVar2) || ((size->ht).m_i != (int)((ulong)uVar2 >> 0x20))) {
    QPlatformBackingStore::window();
    QWindow::screen();
    plVar3 = (long *)QScreen::handle();
    FVar1 = (**(code **)(*plVar3 + 0x38))(plVar3);
    QImage::QImage(local_50,size,FVar1);
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_38 = (code *)0xaaaaaaaaaaaaaaaa;
    uStack_30 = 0xaaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_38);
    uVar2 = local_40;
    local_38 = QTextStream::operator<<;
    local_40 = 0;
    local_28 = *(undefined8 *)&this->field_0x20;
    *(undefined8 *)&this->field_0x20 = uVar2;
    QImage::~QImage((QImage *)&local_38);
    QImage::~QImage(local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbBackingStore::resize(const QSize &size, const QRegion &staticContents)
{
    Q_UNUSED(staticContents);

    if (mImage.size() != size)
        mImage = QImage(size, window()->screen()->handle()->format());
}